

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void iadst8x8_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint uVar26;
  int32_t *piVar27;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i temp2;
  __m256i temp1;
  __m256i x;
  __m256i u [8];
  __m256i kZero;
  __m256i rnding;
  __m256i cospi32;
  __m256i cospi48;
  __m256i cospi16;
  __m256i cospi60;
  __m256i cospi4;
  int32_t *cospi;
  int local_ebc;
  int shift;
  __m256i *in_stack_fffffffffffff1a0;
  __m256i *in_stack_fffffffffffff1a8;
  __m256i *in_stack_fffffffffffff1b0;
  undefined4 in_stack_fffffffffffff1b8;
  undefined8 uVar28;
  undefined8 uVar29;
  longlong lVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  longlong lVar34;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  char local_bd4;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  __m256i *palStack_2c8;
  ulong uStack_58;
  
  piVar27 = cospi_arr(in_EDX);
  uVar26 = piVar27[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar1 = vpinsrd_avx(auVar1,uVar26,2);
  auVar1 = vpinsrd_avx(auVar1,uVar26,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar2 = vpinsrd_avx(auVar2,uVar26,2);
  auVar2 = vpinsrd_avx(auVar2,uVar26,3);
  uStack_450 = auVar2._0_8_;
  uStack_448 = auVar2._8_8_;
  uVar26 = piVar27[0x3c];
  auVar2 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar2 = vpinsrd_avx(auVar2,uVar26,2);
  auVar2 = vpinsrd_avx(auVar2,uVar26,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar3 = vpinsrd_avx(auVar3,uVar26,2);
  auVar3 = vpinsrd_avx(auVar3,uVar26,3);
  uStack_410 = auVar3._0_8_;
  uStack_408 = auVar3._8_8_;
  uVar26 = piVar27[0x10];
  auVar3 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar3 = vpinsrd_avx(auVar3,uVar26,2);
  auVar3 = vpinsrd_avx(auVar3,uVar26,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar4 = vpinsrd_avx(auVar4,uVar26,2);
  auVar4 = vpinsrd_avx(auVar4,uVar26,3);
  uStack_3d0 = auVar4._0_8_;
  uStack_3c8 = auVar4._8_8_;
  uVar26 = piVar27[0x30];
  auVar4 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar4 = vpinsrd_avx(auVar4,uVar26,2);
  auVar4 = vpinsrd_avx(auVar4,uVar26,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar5 = vpinsrd_avx(auVar5,uVar26,2);
  auVar5 = vpinsrd_avx(auVar5,uVar26,3);
  uStack_390 = auVar5._0_8_;
  uStack_388 = auVar5._8_8_;
  uVar26 = piVar27[0x20];
  auVar5 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar5 = vpinsrd_avx(auVar5,uVar26,2);
  auVar5 = vpinsrd_avx(auVar5,uVar26,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar6 = vpinsrd_avx(auVar6,uVar26,2);
  auVar6 = vpinsrd_avx(auVar6,uVar26,3);
  uStack_350 = auVar6._0_8_;
  uStack_348 = auVar6._8_8_;
  local_bd4 = (char)in_EDX;
  uVar26 = 1 << (local_bd4 - 1U & 0x1f);
  auVar6 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar6 = vpinsrd_avx(auVar6,uVar26,2);
  auVar6 = vpinsrd_avx(auVar6,uVar26,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar7 = vpinsrd_avx(auVar7,uVar26,2);
  auVar7 = vpinsrd_avx(auVar7,uVar26,3);
  uStack_310 = auVar7._0_8_;
  uStack_308 = auVar7._8_8_;
  uStack_58 = SUB328(ZEXT832(0),4);
  auVar17._16_8_ = uStack_410;
  auVar17._0_16_ = auVar2;
  auVar17._24_8_ = uStack_408;
  auVar8 = vpmulld_avx2(*in_RDI,auVar17);
  auVar25._16_8_ = uStack_310;
  auVar25._0_16_ = auVar6;
  auVar25._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar25);
  auVar10 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar11._16_8_ = uStack_450;
  auVar11._0_16_ = auVar1;
  auVar11._24_8_ = uStack_448;
  auVar8 = vpmulld_avx2(*in_RDI,auVar11);
  auVar8 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar8);
  auVar24._16_8_ = uStack_310;
  auVar24._0_16_ = auVar6;
  auVar24._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar24);
  auVar11 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  local_de0 = auVar10._0_8_;
  uStack_dd8 = auVar10._8_8_;
  uStack_dd0 = auVar10._16_8_;
  uStack_dc8 = auVar10._24_8_;
  auVar16._16_8_ = uStack_3d0;
  auVar16._0_16_ = auVar3;
  auVar16._24_8_ = uStack_3c8;
  auVar8 = vpmulld_avx2(auVar10,auVar16);
  auVar12._16_8_ = uStack_390;
  auVar12._0_16_ = auVar4;
  auVar12._24_8_ = uStack_388;
  auVar9 = vpmulld_avx2(auVar11,auVar12);
  auVar8 = vpaddd_avx2(auVar8,auVar9);
  auVar23._16_8_ = uStack_310;
  auVar23._0_16_ = auVar6;
  auVar23._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar23);
  auVar12 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar15._16_8_ = uStack_390;
  auVar15._0_16_ = auVar4;
  auVar15._24_8_ = uStack_388;
  auVar8 = vpmulld_avx2(auVar10,auVar15);
  uVar28 = auVar8._0_8_;
  uVar29 = auVar8._8_8_;
  lVar30 = auVar8._16_8_;
  uVar31 = auVar8._24_8_;
  auVar13._16_8_ = uStack_3d0;
  auVar13._0_16_ = auVar3;
  auVar13._24_8_ = uStack_3c8;
  auVar9 = vpmulld_avx2(auVar11,auVar13);
  auVar8 = vpsubd_avx2(auVar8,auVar9);
  auVar22._16_8_ = uStack_310;
  auVar22._0_16_ = auVar6;
  auVar22._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar22);
  auVar13 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar14._16_8_ = uStack_350;
  auVar14._0_16_ = auVar5;
  auVar14._24_8_ = uStack_348;
  auVar9 = vpmulld_avx2(auVar10,auVar14);
  auVar10._16_8_ = uStack_350;
  auVar10._0_16_ = auVar5;
  auVar10._24_8_ = uStack_348;
  auVar10 = vpmulld_avx2(auVar11,auVar10);
  auVar8 = vpaddd_avx2(auVar9,auVar10);
  auVar21._16_8_ = uStack_310;
  auVar21._0_16_ = auVar6;
  auVar21._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar21);
  auVar14 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar8 = vpsubd_avx2(auVar9,auVar10);
  auVar20._16_8_ = uStack_310;
  auVar20._0_16_ = auVar6;
  auVar20._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar20);
  auVar15 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar9._16_8_ = uStack_350;
  auVar9._0_16_ = auVar5;
  auVar9._24_8_ = uStack_348;
  auVar9 = vpmulld_avx2(auVar12,auVar9);
  uVar32 = auVar9._0_8_;
  uVar33 = auVar9._8_8_;
  lVar34 = auVar9._16_8_;
  local_d40 = auVar13._0_8_;
  uStack_d38 = auVar13._8_8_;
  uStack_d30 = auVar13._16_8_;
  uStack_d28 = auVar13._24_8_;
  auVar8._16_8_ = uStack_350;
  auVar8._0_16_ = auVar5;
  auVar8._24_8_ = uStack_348;
  auVar10 = vpmulld_avx2(auVar13,auVar8);
  auVar8 = vpaddd_avx2(auVar9,auVar10);
  auVar19._16_8_ = uStack_310;
  auVar19._0_16_ = auVar6;
  auVar19._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar19);
  auVar13 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  auVar8 = vpsubd_avx2(auVar9,auVar10);
  auVar18._16_8_ = uStack_310;
  auVar18._0_16_ = auVar6;
  auVar18._24_8_ = uStack_308;
  auVar8 = vpaddd_avx2(auVar8,auVar18);
  auVar8 = vpsrad_avx2(auVar8,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_ebc = 0x10;
    }
    else {
      local_ebc = in_R8D + 6;
    }
    uVar26 = -(1 << ((char)local_ebc - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
    auVar1 = vpinsrd_avx(auVar1,uVar26,2);
    vpinsrd_avx(auVar1,uVar26,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
    auVar1 = vpinsrd_avx(auVar1,uVar26,2);
    auVar1 = vpinsrd_avx(auVar1,uVar26,3);
    palStack_2c8 = auVar1._8_8_;
    uVar26 = (1 << ((char)local_ebc - 1U & 0x1f)) - 1;
    auVar2 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
    auVar2 = vpinsrd_avx(auVar2,uVar26,2);
    vpinsrd_avx(auVar2,uVar26,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
    auVar2 = vpinsrd_avx(auVar2,uVar26,2);
    vpinsrd_avx(auVar2,uVar26,3);
    in0[1] = uVar32;
    in0[0] = uVar31;
    in0[2] = uVar33;
    in0[3] = lVar34;
    in1[0]._4_4_ = local_ebc;
    in1[0]._0_4_ = in_stack_fffffffffffff1b8;
    in1[1] = uVar28;
    in1[2] = uVar29;
    in1[3] = lVar30;
    shift = auVar1._4_4_;
    neg_shift_avx2(in0,in1,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                   in_stack_fffffffffffff1a0,palStack_2c8,shift);
    in0_00[1] = uVar32;
    in0_00[0] = uVar31;
    in0_00[2] = uVar33;
    in0_00[3] = lVar34;
    in1_00[0]._4_4_ = local_ebc;
    in1_00[0]._0_4_ = in_stack_fffffffffffff1b8;
    in1_00[1] = uVar28;
    in1_00[2] = uVar29;
    in1_00[3] = lVar30;
    neg_shift_avx2(in0_00,in1_00,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                   in_stack_fffffffffffff1a0,palStack_2c8,shift);
    in0_01[1] = uVar32;
    in0_01[0] = uVar31;
    in0_01[2] = uVar33;
    in0_01[3] = lVar34;
    in1_01[0]._4_4_ = local_ebc;
    in1_01[0]._0_4_ = in_stack_fffffffffffff1b8;
    in1_01[1] = uVar28;
    in1_01[2] = uVar29;
    in1_01[3] = lVar30;
    neg_shift_avx2(in0_01,in1_01,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                   in_stack_fffffffffffff1a0,palStack_2c8,shift);
    in0_02[1] = uVar32;
    in0_02[0] = uVar31;
    in0_02[2] = uVar33;
    in0_02[3] = lVar34;
    in1_02[0]._4_4_ = local_ebc;
    in1_02[0]._0_4_ = in_stack_fffffffffffff1b8;
    in1_02[1] = uVar28;
    in1_02[2] = uVar29;
    in1_02[3] = lVar30;
    neg_shift_avx2(in0_02,in1_02,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
                   in_stack_fffffffffffff1a0,palStack_2c8,shift);
  }
  else {
    *in_RSI = local_de0;
    in_RSI[1] = uStack_dd8;
    in_RSI[2] = uStack_dd0;
    in_RSI[3] = uStack_dc8;
    auVar9 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar12);
    *(undefined1 (*) [32])(in_RSI + 4) = auVar9;
    local_d20 = auVar13._0_8_;
    uStack_d18 = auVar13._8_8_;
    uStack_d10 = auVar13._16_8_;
    uStack_d08 = auVar13._24_8_;
    in_RSI[8] = local_d20;
    in_RSI[9] = uStack_d18;
    in_RSI[10] = uStack_d10;
    in_RSI[0xb] = uStack_d08;
    auVar9 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar14);
    *(undefined1 (*) [32])(in_RSI + 0xc) = auVar9;
    local_d80 = auVar15._0_8_;
    uStack_d78 = auVar15._8_8_;
    uStack_d70 = auVar15._16_8_;
    uStack_d68 = auVar15._24_8_;
    in_RSI[0x10] = local_d80;
    in_RSI[0x11] = uStack_d78;
    in_RSI[0x12] = uStack_d70;
    in_RSI[0x13] = uStack_d68;
    auVar8 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar8);
    *(undefined1 (*) [32])(in_RSI + 0x14) = auVar8;
    in_RSI[0x18] = local_d40;
    in_RSI[0x19] = uStack_d38;
    in_RSI[0x1a] = uStack_d30;
    in_RSI[0x1b] = uStack_d28;
    auVar8 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar11);
    *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar8;
  }
  return;
}

Assistant:

static void iadst8x8_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  __m256i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(x, rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(kZero, x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m256i temp1, temp2;
  temp1 = _mm256_mullo_epi32(u[0], cospi16);
  x = _mm256_mullo_epi32(u[1], cospi48);
  temp1 = _mm256_add_epi32(temp1, x);
  temp1 = _mm256_add_epi32(temp1, rnding);
  temp1 = _mm256_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm256_mullo_epi32(u[0], cospi48);
  x = _mm256_mullo_epi32(u[1], cospi16);
  u[5] = _mm256_sub_epi32(temp2, x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm256_mullo_epi32(u[0], cospi32);
  x = _mm256_mullo_epi32(u[1], cospi32);
  u[2] = _mm256_add_epi32(temp1, x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(temp1, x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  temp1 = _mm256_mullo_epi32(u[4], cospi32);
  x = _mm256_mullo_epi32(u[5], cospi32);
  u[6] = _mm256_add_epi32(temp1, x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(temp1, x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}